

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

short duckdb::MultiplyOperatorOverflowCheck::Operation<short,short,short>(short left,short right)

{
  short sVar1;
  int iVar2;
  OutOfRangeException *this;
  PhysicalType type;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar2 = (int)CONCAT62(in_register_00000032,right) * (int)CONCAT62(in_register_0000003a,left);
  sVar1 = (short)iVar2;
  if (sVar1 == iVar2) {
    return sVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in multiplication of %s (%s * %s)!",&local_99);
  TypeIdToString_abi_cxx11_(&local_58,(duckdb *)0x5,type);
  NumericHelper::ToString<short>(&local_78,left);
  NumericHelper::ToString<short>(&local_98,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,&local_58,&local_78,&local_98);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		return left * right;
	}